

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::Regexp::Destroy(Regexp *this)

{
  uint16 *puVar1;
  Regexp *pRVar2;
  bool bVar3;
  ostream *poVar4;
  Regexp **ppRVar5;
  Regexp *sub;
  int i;
  Regexp **subs;
  LogMessage local_1a0;
  Regexp *local_20;
  Regexp *re;
  Regexp *stack;
  Regexp *this_local;
  
  stack = this;
  bVar3 = QuickDestroy(this);
  if (!bVar3) {
    this->down_ = (Regexp *)0x0;
    re = this;
    while (re != (Regexp *)0x0) {
      local_20 = re;
      ppRVar5 = &re->down_;
      puVar1 = &re->ref_;
      re = *ppRVar5;
      if (*puVar1 != 0) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.cc",
                   0x85);
        poVar4 = LogMessage::stream(&local_1a0);
        poVar4 = std::operator<<(poVar4,"Bad reference count ");
        std::ostream::operator<<(poVar4,local_20->ref_);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
      }
      if (local_20->nsub_ != 0) {
        ppRVar5 = Regexp::sub(local_20);
        for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)local_20->nsub_; sub._4_4_ = sub._4_4_ + 1) {
          pRVar2 = ppRVar5[sub._4_4_];
          if (pRVar2 != (Regexp *)0x0) {
            if (pRVar2->ref_ == 0xffff) {
              Decref(pRVar2);
            }
            else {
              pRVar2->ref_ = pRVar2->ref_ - 1;
            }
            if ((pRVar2->ref_ == 0) && (bVar3 = QuickDestroy(pRVar2), !bVar3)) {
              pRVar2->down_ = re;
              re = pRVar2;
            }
          }
        }
        if ((1 < local_20->nsub_) && (ppRVar5 != (Regexp **)0x0)) {
          operator_delete__(ppRVar5);
        }
        local_20->nsub_ = 0;
      }
      pRVar2 = local_20;
      if (local_20 != (Regexp *)0x0) {
        ~Regexp(local_20);
        operator_delete(pRVar2);
      }
    }
  }
  return;
}

Assistant:

void Regexp::Destroy() {
  if (QuickDestroy())
    return;

  // Handle recursive Destroy with explicit stack
  // to avoid arbitrarily deep recursion on process stack [sigh].
  down_ = NULL;
  Regexp* stack = this;
  while (stack != NULL) {
    Regexp* re = stack;
    stack = re->down_;
    if (re->ref_ != 0)
      LOG(DFATAL) << "Bad reference count " << re->ref_;
    if (re->nsub_ > 0) {
      Regexp** subs = re->sub();
      for (int i = 0; i < re->nsub_; i++) {
        Regexp* sub = subs[i];
        if (sub == NULL)
          continue;
        if (sub->ref_ == kMaxRef)
          sub->Decref();
        else
          --sub->ref_;
        if (sub->ref_ == 0 && !sub->QuickDestroy()) {
          sub->down_ = stack;
          stack = sub;
        }
      }
      if (re->nsub_ > 1)
        delete[] subs;
      re->nsub_ = 0;
    }
    delete re;
  }
}